

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateArenaString
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  Descriptor *this_00;
  Options *options;
  char *pcVar3;
  reference pvVar4;
  ulong uVar5;
  LogMessage *pLVar6;
  Options *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  undefined1 auVar7 [16];
  LogFinisher local_212;
  byte local_211;
  LogMessage local_210;
  Hex local_1d8;
  int local_1c8;
  LogFinisher local_1c2;
  byte local_1c1;
  LogMessage local_1c0;
  int local_188;
  LogFinisher local_182;
  byte local_181;
  int inlined_string_index;
  byte local_142;
  byte local_141;
  string local_140;
  byte local_11a;
  byte local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  byte local_b2;
  byte local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string default_string;
  string local_40;
  cpp *local_20;
  FieldDescriptor *field_local;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  local_20 = (cpp *)field;
  field_local = (FieldDescriptor *)format;
  format_local = (Formatter *)this;
  bVar2 = HasHasbit(field);
  pFVar1 = field_local;
  if (bVar2) {
    FieldName_abi_cxx11_(&local_40,local_20,field_00);
    Formatter::operator()((Formatter *)pFVar1,"_Internal::set_has_$1$(&$has_bits$);\n",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)local_20);
  auVar7 = std::__cxx11::string::empty();
  local_b1 = 0;
  local_b2 = 0;
  local_119 = 0;
  local_11a = 0;
  local_141 = 0;
  local_142 = 0;
  if ((auVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    this_00 = FieldDescriptor::containing_type((FieldDescriptor *)local_20);
    QualifiedClassName_abi_cxx11_(&local_118,(cpp *)this_00,(Descriptor *)this->options_,in_RCX);
    local_119 = 1;
    std::operator+(&local_f8,&local_118,"::");
    local_11a = 1;
    MakeDefaultName_abi_cxx11_(&local_140,local_20,field_01);
    local_141 = 1;
    std::operator+(&local_d8,&local_f8,&local_140);
    local_142 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_d8,".get()");
  }
  else {
    ProtobufNamespace_abi_cxx11_(&local_b0,(cpp *)this->options_,auVar7._8_8_);
    local_b1 = 1;
    std::operator+(&local_90,"::",&local_b0);
    local_b2 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_90,"::internal::GetEmptyStringAlreadyInited()");
  }
  if ((local_142 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((local_141 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_140);
  }
  if ((local_11a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_f8);
  }
  if ((local_119 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_118);
  }
  if ((local_b2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((local_b1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  Formatter::operator()<>
            ((Formatter *)field_local,
             "if (arena != nullptr) {\n  ptr = ctx->ReadArenaString(ptr, &$msg$$name$_, arena");
  options = this->options_;
  bVar2 = IsStringInlined((FieldDescriptor *)local_20,options);
  if (bVar2) {
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
    local_181 = 0;
    __c = extraout_EDX;
    if (bVar2) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&inlined_string_index,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x27d);
      local_181 = 1;
      options = (Options *)
                internal::LogMessage::operator<<
                          ((LogMessage *)&inlined_string_index,
                           "CHECK failed: !inlined_string_indices_.empty(): ");
      internal::LogFinisher::operator=(&local_182,(LogMessage *)options);
      __c = extraout_EDX_00;
    }
    if ((local_181 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)&inlined_string_index);
      __c = extraout_EDX_01;
    }
    pcVar3 = FieldDescriptor::index((FieldDescriptor *)local_20,(char *)options,__c);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->inlined_string_indices_,(long)(int)pcVar3);
    local_188 = *pvVar4;
    local_1c1 = 0;
    if (local_188 < 0) {
      internal::LogMessage::LogMessage
                (&local_1c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x27f);
      local_1c1 = 1;
      pLVar6 = internal::LogMessage::operator<<
                         (&local_1c0,"CHECK failed: (inlined_string_index) >= (0): ");
      internal::LogFinisher::operator=(&local_1c2,pLVar6);
    }
    if ((local_1c1 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_1c0);
    }
    pFVar1 = field_local;
    local_1c8 = local_188;
    if (local_188 < 0) {
      local_1c8 = local_188 + 0x1f;
    }
    local_1c8 = local_1c8 >> 5;
    strings::Hex::Hex<unsigned_int>(&local_1d8,1 << ((byte)local_188 & 0x1f),ZERO_PAD_8);
    Formatter::operator()
              ((Formatter *)pFVar1,
               ", $msg$_internal_$name$_donated(), &$msg$_inlined_string_donated_[$1$], ~0x$2$u",
               &local_1c8,&local_1d8);
  }
  else {
    local_211 = 0;
    FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)local_20);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      internal::LogMessage::LogMessage
                (&local_210,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x287);
      local_211 = 1;
      pLVar6 = internal::LogMessage::operator<<
                         (&local_210,"CHECK failed: field->default_value_string().empty(): ");
      internal::LogFinisher::operator=(&local_212,pLVar6);
    }
    if ((local_211 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_210);
    }
  }
  Formatter::operator()
            ((Formatter *)field_local,
             ");\n} else {\n  ptr = ::$proto_ns$::internal::InlineGreedyStringParser($msg$$name$_.MutableNoArenaNoDefault(&$1$), ptr, ctx);\n}\nconst std::string* str = &$msg$$name$_.Get(); (void)str;\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateArenaString(Formatter& format,
                                                 const FieldDescriptor* field) {
  if (HasHasbit(field)) {
    format("_Internal::set_has_$1$(&$has_bits$);\n", FieldName(field));
  }
  std::string default_string =
      field->default_value_string().empty()
          ? "::" + ProtobufNamespace(options_) +
                "::internal::GetEmptyStringAlreadyInited()"
          : QualifiedClassName(field->containing_type(), options_) +
                "::" + MakeDefaultName(field) + ".get()";
  format(
      "if (arena != nullptr) {\n"
      "  ptr = ctx->ReadArenaString(ptr, &$msg$$name$_, arena");
  if (IsStringInlined(field, options_)) {
    GOOGLE_DCHECK(!inlined_string_indices_.empty());
    int inlined_string_index = inlined_string_indices_[field->index()];
    GOOGLE_DCHECK_GE(inlined_string_index, 0);
    format(
        ", $msg$_internal_$name$_donated()"
        ", &$msg$_inlined_string_donated_[$1$]"
        ", ~0x$2$u",
        inlined_string_index / 32,
        strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8));
  } else {
    GOOGLE_DCHECK(field->default_value_string().empty());
  }
  format(
      ");\n"
      "} else {\n"
      "  ptr = ::$proto_ns$::internal::InlineGreedyStringParser("
      "$msg$$name$_.MutableNoArenaNoDefault(&$1$), ptr, ctx);\n"
      "}\n"
      "const std::string* str = &$msg$$name$_.Get(); (void)str;\n",
      default_string);
}